

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O3

ssize_t __thiscall
phosg::BitReader::pread(BitReader *this,int __fd,void *__buf,size_t __nbytes,__off_t __offset)

{
  long lVar1;
  logic_error *this_00;
  ulong uVar2;
  undefined4 in_register_00000034;
  ulong uVar3;
  
  uVar3 = CONCAT44(in_register_00000034,__fd);
  if (0x40 < (byte)__buf) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    ::std::logic_error::logic_error(this_00,"BitReader cannot return more than 64 bits at once");
    __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
  }
  if ((byte)__buf == 0) {
    lVar1 = 0;
  }
  else {
    uVar2 = (ulong)__buf & 0xff;
    lVar1 = 0;
    do {
      lVar1 = (ulong)((this->data[uVar3 >> 3] >> (~(byte)uVar3 & 7) & 1) != 0) + lVar1 * 2;
      uVar3 = uVar3 + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return lVar1;
}

Assistant:

uint64_t BitReader::pread(size_t start_offset, uint8_t size) {
  if (size > 64) {
    throw logic_error("BitReader cannot return more than 64 bits at once");
  }

  uint64_t ret = 0;
  for (uint8_t ret_bits = 0; ret_bits < size; ret_bits++) {
    size_t bit_offset = start_offset + ret_bits;
    ret = (ret << 1) | ((this->data[bit_offset >> 3] >> (7 - (bit_offset & 7))) & 1);
  }
  return ret;
}